

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

bool __thiscall
Js::EquivalentTypeCache::ClearUnusedTypes(EquivalentTypeCache *this,Recycler *recycler)

{
  Type *address;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  JitPolyEquivalentTypeGuard *pJVar6;
  void *address_00;
  PropertyGuard *pPVar7;
  ulong uVar8;
  uint8 i;
  uint8 uVar9;
  ushort uVar10;
  
  pPVar7 = this->guard;
  if (pPVar7 == (PropertyGuard *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x229e,"(this->guard)","this->guard");
    if (!bVar2) goto LAB_00773457;
    *puVar5 = 0;
    pPVar7 = this->guard;
  }
  if (((ulong)pPVar7->value & 0xfffffffffffffffd) == 0) {
LAB_0077328b:
    bVar2 = false;
  }
  else if (pPVar7->isPoly == true) {
    pJVar6 = PropertyGuard::AsPolyTypeCheckGuard(pPVar7);
    uVar9 = '\0';
    bVar4 = false;
    do {
      address_00 = (void *)JitPolyEquivalentTypeGuard::GetPolyValue(pJVar6,uVar9);
      bVar2 = bVar4;
      if ((long)address_00 - 3U < 0xfffffffffffffffe) {
        bVar3 = Memory::HeapBlockMap64::IsMarked(&recycler->heapBlockMap,address_00);
        bVar2 = true;
        if (!bVar3) {
          JitPolyEquivalentTypeGuard::InvalidateDuringSweep(pJVar6,uVar9);
          bVar2 = bVar4;
        }
      }
      uVar9 = uVar9 + '\x01';
      bVar4 = bVar2;
    } while (uVar9 != '\b');
  }
  else {
    bVar4 = Memory::HeapBlockMap64::IsMarked(&recycler->heapBlockMap,(void *)pPVar7->value);
    bVar2 = true;
    if (!bVar4) {
      pPVar7 = this->guard;
      pPVar7->wasReincarnated = true;
      pPVar7->value = 2;
      if (pPVar7->isPoly == true) {
        pJVar6 = PropertyGuard::AsPolyTypeCheckGuard(pPVar7);
        uVar9 = '\0';
        do {
          JitPolyEquivalentTypeGuard::InvalidateDuringSweep(pJVar6,uVar9);
          uVar9 = uVar9 + '\x01';
        } while (uVar9 != '\b');
      }
      goto LAB_0077328b;
    }
  }
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  uVar8 = 0;
  bVar4 = false;
  uVar10 = 0;
  do {
    address = this->types[uVar8];
    if (address == (Type *)0x0) {
      if (uVar8 < 8) goto LAB_0077332a;
      break;
    }
    this->types[uVar8] = (Type *)0x0;
    bVar3 = Memory::HeapBlockMap64::IsMarked(&recycler->heapBlockMap,address);
    if (bVar3) {
      this->types[uVar10] = address;
      if (this->guard->isPoly == false) {
        bVar4 = (bool)(bVar4 | (Type *)this->guard->value == address);
        uVar10 = uVar10 + 1;
      }
      else {
        bVar4 = true;
        uVar10 = uVar10 + 1;
      }
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != 8);
  goto LAB_0077337e;
LAB_0077332a:
  do {
    if (this->types[uVar8] != (Type *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x22e1,"(this->types[__i] == nullptr)",
                                  "this->types[__i] == nullptr");
      if (!bVar3) goto LAB_00773457;
      *puVar5 = 0;
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != 8);
LAB_0077337e:
  pPVar7 = this->guard;
  if (uVar10 == 0) {
    if (pPVar7->isPoly != true) {
      if (pPVar7->value != 2) {
        return bVar2;
      }
      pPVar7->value = 0;
      return bVar2;
    }
    if (bVar2) {
      return bVar2;
    }
    pPVar7->value = 0;
    pJVar6 = PropertyGuard::AsPolyTypeCheckGuard(pPVar7);
    uVar9 = '\0';
    do {
      JitPolyEquivalentTypeGuard::Invalidate(pJVar6,uVar9);
      uVar9 = uVar9 + '\x01';
    } while (uVar9 != '\b');
    pPVar7 = this->guard;
  }
  else {
    bVar2 = true;
  }
  if (((pPVar7->value & 0xfffffffffffffffdU) != 0) && (uVar10 != 0 && !bVar4)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x22fb,
                                "(!this->guard->IsValid() || isGuardValuePresent || nonNullIndex == 0)"
                                ,
                                "After ClearUnusedTypes, valid guard value should be one of the cached equivalent types."
                               );
    if (!bVar4) {
LAB_00773457:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  return bVar2;
}

Assistant:

bool EquivalentTypeCache::ClearUnusedTypes(Recycler *recycler)
    {
        bool isAnyTypeLive = false;

        Assert(this->guard);
        if (this->guard->IsValid())
        {
            if (this->guard->IsPoly())
            {
                JitPolyEquivalentTypeGuard * polyGuard = this->guard->AsPolyTypeCheckGuard();
                for (uint8 i = 0; i < polyGuard->GetSize(); i++)
                {
                    intptr_t value = polyGuard->GetPolyValue(i);
                    if (value != PropertyGuard::GuardValue::Uninitialized && value != PropertyGuard::GuardValue::Invalidated_DuringSweep)
                    {
                        Type *type = reinterpret_cast<Type*>(value);
                        if (!recycler->IsObjectMarked(type))
                        {
                            polyGuard->InvalidateDuringSweep(i);
                        }
                        else
                        {
                            isAnyTypeLive = true;
                        }
                    }
                }
            }
            else
            {
                Type *type = reinterpret_cast<Type*>(this->guard->GetValue());
                if (!recycler->IsObjectMarked(type))
                {
                    this->guard->InvalidateDuringSweep();
                }
                else
                {
                    isAnyTypeLive = true;
                }
            }
        }
        uint16 nonNullIndex = 0;
#if DBG
        bool isGuardValuePresent = false;
#endif
        for (int i = 0; i < EQUIVALENT_TYPE_CACHE_SIZE; i++)
        {
            Type *type = this->types[i];
            if (type != nullptr)
            {
                this->types[i] = nullptr;
                if (recycler->IsObjectMarked(type))
                {
                    // compact the types array by moving non-null types
                    // to the beginning.
                    this->types[nonNullIndex++] = type;
#if DBG
                    if (guard->IsPoly())
                    {
                        isGuardValuePresent = true;
                    }
                    else if (this->guard->GetValue() == reinterpret_cast<intptr_t>(type))
                    {
                        isGuardValuePresent = true;
                    }
#endif
                }
            }
            else
            {
#ifdef DEBUG
                for (int __i = i; __i < EQUIVALENT_TYPE_CACHE_SIZE; __i++)
                { Assert(this->types[__i] == nullptr); }
#endif
                break; // array must be shrinked already
            }
        }

        if (nonNullIndex > 0)
        {
            isAnyTypeLive = true;
        }
        else if (guard->IsPoly())
        {
            if (!isAnyTypeLive)
            {
                guard->Invalidate();
            }
        }
        else if (guard->IsInvalidatedDuringSweep())
        {
            // just mark this as actual invalidated since there are no types
            // present
            guard->Invalidate();
        }

        // verify if guard value is valid, it is present in one of the types
        AssertMsg(!this->guard->IsValid() || isGuardValuePresent || nonNullIndex == 0,
            "After ClearUnusedTypes, valid guard value should be one of the cached equivalent types.");
        return isAnyTypeLive;
    }